

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase *
EvaluateFunction(ExpressionEvalContext *ctx,ExprFunctionDefinition *expression,ExprBase *context,
                ArrayView<ExprBase_*> arguments)

{
  SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *this;
  uint uVar1;
  Allocator *pAVar2;
  VariableData *pVVar3;
  StackVariable *pSVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  ExprPointerLiteral *pEVar8;
  ExprBase *pEVar9;
  ExprBase *pEVar10;
  char *__function;
  uint uVar11;
  ExprVariableDefinition *pEVar12;
  StackFrame *pSVar7;
  
  if (ctx->instructionsLimit <= ctx->instruction) {
    Report(ctx,"ERROR: instruction limit reached");
    return (ExprBase *)0x0;
  }
  ctx->instruction = ctx->instruction + 1;
  if (ctx->stackDepthLimit <= (ctx->stackFrames).count) {
    Report(ctx,"ERROR: stack depth limit");
    return (ExprBase *)0x0;
  }
  this = &ctx->stackFrames;
  iVar6 = (*ctx->ctx->allocator->_vptr_Allocator[2])();
  pSVar7 = (StackFrame *)CONCAT44(extraout_var,iVar6);
  pAVar2 = ctx->ctx->allocator;
  pSVar7->owner = expression->function;
  pSVar4 = (pSVar7->variables).little;
  memset(pSVar4,0,0x200);
  (pSVar7->variables).allocator = pAVar2;
  (pSVar7->variables).data = pSVar4;
  (pSVar7->variables).count = 0;
  (pSVar7->variables).max = 0x20;
  pSVar7->returnValue = (ExprBase *)0x0;
  pSVar7->targetYield = 0;
  pSVar7->breakDepth = 0;
  pSVar7->continueDepth = 0;
  uVar11 = (ctx->stackFrames).count;
  if (uVar11 == (ctx->stackFrames).max) {
    SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::grow(this,uVar11);
  }
  if (this->data != (StackFrame **)0x0) {
    uVar11 = (ctx->stackFrames).count;
    (ctx->stackFrames).count = uVar11 + 1;
    this->data[uVar11] = pSVar7;
    if (uVar11 + 1 == 0) {
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x172,
                    "T &SmallArray<ExpressionEvalContext::StackFrame *, 32>::back() [T = ExpressionEvalContext::StackFrame *, N = 32]"
                   );
    }
    pSVar7 = this->data[uVar11];
    pEVar12 = expression->contextArgument;
    if (pEVar12 != (ExprVariableDefinition *)0x0) {
      pEVar8 = AllocateTypeStorage(ctx,(pEVar12->super_ExprBase).source,
                                   pEVar12->variable->variable->type);
      if (pEVar8 == (ExprPointerLiteral *)0x0) {
        return (ExprBase *)0x0;
      }
      pVVar3 = pEVar12->variable->variable;
      uVar11 = (pSVar7->variables).count;
      if (uVar11 == (pSVar7->variables).max) {
        SmallArray<ExpressionEvalContext::StackVariable,_32U>::grow(&pSVar7->variables,uVar11);
      }
      pSVar4 = (pSVar7->variables).data;
      if (pSVar4 == (StackVariable *)0x0) {
LAB_0014e8da:
        __function = 
        "void SmallArray<ExpressionEvalContext::StackVariable, 32>::push_back(const T &) [T = ExpressionEvalContext::StackVariable, N = 32]"
        ;
        goto LAB_0014e8ef;
      }
      uVar11 = (pSVar7->variables).count;
      (pSVar7->variables).count = uVar11 + 1;
      pSVar4[uVar11].variable = pVVar3;
      pSVar4[uVar11].ptr = pEVar8;
      bVar5 = CreateStore(ctx,&pEVar8->super_ExprBase,context);
      if (!bVar5) {
        return (ExprBase *)0x0;
      }
    }
    pEVar12 = (expression->arguments).head;
    if (pEVar12 != (ExprVariableDefinition *)0x0) {
      uVar11 = 0;
      do {
        pEVar8 = AllocateTypeStorage(ctx,(pEVar12->super_ExprBase).source,
                                     pEVar12->variable->variable->type);
        if (pEVar8 == (ExprPointerLiteral *)0x0) {
          bVar5 = false;
        }
        else {
          pVVar3 = pEVar12->variable->variable;
          uVar1 = (pSVar7->variables).count;
          if (uVar1 == (pSVar7->variables).max) {
            SmallArray<ExpressionEvalContext::StackVariable,_32U>::grow(&pSVar7->variables,uVar1);
          }
          pSVar4 = (pSVar7->variables).data;
          if (pSVar4 == (StackVariable *)0x0) goto LAB_0014e8da;
          uVar1 = (pSVar7->variables).count;
          (pSVar7->variables).count = uVar1 + 1;
          pSVar4[uVar1].variable = pVVar3;
          pSVar4[uVar1].ptr = pEVar8;
          if (arguments.count <= uVar11) {
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x22a,
                          "T &ArrayView<ExprBase *>::operator[](unsigned int) [T = ExprBase *]");
          }
          bVar5 = CreateStore(ctx,&pEVar8->super_ExprBase,arguments.data[uVar11]);
          uVar11 = uVar11 + bVar5;
        }
        if (bVar5 == false) {
          return (ExprBase *)0x0;
        }
        pEVar12 = (ExprVariableDefinition *)(pEVar12->super_ExprBase).next;
        if ((pEVar12 == (ExprVariableDefinition *)0x0) || ((pEVar12->super_ExprBase).typeID != 0x1e)
           ) {
          pEVar12 = (ExprVariableDefinition *)0x0;
        }
      } while (pEVar12 != (ExprVariableDefinition *)0x0);
    }
    if (expression->coroutineStateRead != (ExprBase *)0x0) {
      pEVar9 = Evaluate(ctx,expression->coroutineStateRead);
      if ((pEVar9 == (ExprBase *)0x0) || (pEVar9->typeID != 6)) {
        pEVar9 = (ExprBase *)0x0;
      }
      if (pEVar9 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      pSVar7->targetYield = *(uint *)&pEVar9[1]._vptr_ExprBase;
    }
    for (pEVar9 = (expression->expressions).head; pEVar9 != (ExprBase *)0x0; pEVar9 = pEVar9->next)
    {
      pEVar10 = Evaluate(ctx,pEVar9);
      if (pEVar10 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      if ((pSVar7->breakDepth != 0) || (pSVar7->continueDepth != 0)) {
        __assert_fail("frame->breakDepth == 0 && frame->continueDepth == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,2000,
                      "ExprBase *EvaluateFunction(ExpressionEvalContext &, ExprFunctionDefinition *, ExprBase *, ArrayView<ExprBase *>)"
                     );
      }
      if (pSVar7->returnValue != (ExprBase *)0x0) break;
    }
    pEVar9 = pSVar7->returnValue;
    if (pEVar9 == (ExprBase *)0x0) {
      ReportCritical(ctx,"ERROR: function didn\'t return a value");
      return (ExprBase *)0x0;
    }
    uVar11 = (ctx->stackFrames).count;
    if (uVar11 == 0) {
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x183,
                    "void SmallArray<ExpressionEvalContext::StackFrame *, 32>::pop_back() [T = ExpressionEvalContext::StackFrame *, N = 32]"
                   );
    }
    (ctx->stackFrames).count = uVar11 - 1;
    return pEVar9;
  }
  __function = 
  "void SmallArray<ExpressionEvalContext::StackFrame *, 32>::push_back(const T &) [T = ExpressionEvalContext::StackFrame *, N = 32]"
  ;
LAB_0014e8ef:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

ExprBase* EvaluateFunction(ExpressionEvalContext &ctx, ExprFunctionDefinition *expression, ExprBase *context, ArrayView<ExprBase*> arguments)
{
	if(!AddInstruction(ctx))
		return NULL;

	if(ctx.stackFrames.size() >= ctx.stackDepthLimit)
		return Report(ctx, "ERROR: stack depth limit");

	ctx.stackFrames.push_back(new (ctx.ctx.get<ExpressionEvalContext::StackFrame>()) ExpressionEvalContext::StackFrame(ctx.ctx.allocator, expression->function));

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(ExprVariableDefinition *curr = expression->contextArgument)
	{
		ExprPointerLiteral *storage = AllocateTypeStorage(ctx, curr->source, curr->variable->variable->type);

		if(!storage)
			return NULL;

		frame->variables.push_back(ExpressionEvalContext::StackVariable(curr->variable->variable, storage));

		if(!CreateStore(ctx, storage, context))
			return NULL;
	}

	unsigned pos = 0;

	for(ExprVariableDefinition *curr = expression->arguments.head; curr; curr = getType<ExprVariableDefinition>(curr->next))
	{
		ExprPointerLiteral *storage = AllocateTypeStorage(ctx, curr->source, curr->variable->variable->type);

		if(!storage)
			return NULL;

		frame->variables.push_back(ExpressionEvalContext::StackVariable(curr->variable->variable, storage));

		if(!CreateStore(ctx, storage, arguments[pos]))
			return NULL;

		pos++;
	}

	if(expression->coroutineStateRead)
	{
		if(ExprIntegerLiteral *jmpOffset = getType<ExprIntegerLiteral>(Evaluate(ctx, expression->coroutineStateRead)))
		{
			frame->targetYield = unsigned(jmpOffset->value);
		}
		else
		{
			return NULL;
		}
	}

	for(ExprBase *value = expression->expressions.head; value; value = value->next)
	{
		if(!Evaluate(ctx, value))
			return NULL;

		assert(frame->breakDepth == 0 && frame->continueDepth == 0);

		if(frame->returnValue)
			break;
	}

	ExprBase *result = frame->returnValue;

	if(!result)
		return ReportCritical(ctx, "ERROR: function didn't return a value");

	ctx.stackFrames.pop_back();

	return result;
}